

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_doors.cpp
# Opt level: O0

void __thiscall DAnimatedDoor::Tick(DAnimatedDoor *this)

{
  bool bVar1;
  int iVar2;
  DAnimatedDoor *this_local;
  
  if (this->m_DoorAnim == (FDoorAnimation *)0x0) {
    (*(this->super_DMovingCeiling).super_DMover.super_DSectorEffect.super_DThinker.super_DObject.
      _vptr_DObject[4])();
  }
  else {
    switch(this->m_Status) {
    case 0:
      iVar2 = this->m_Timer;
      this->m_Timer = iVar2 + -1;
      if (iVar2 == 0) {
        iVar2 = this->m_Frame + 1;
        this->m_Frame = iVar2;
        if (iVar2 < this->m_DoorAnim->NumTextureFrames) {
          this->m_Timer = this->m_Speed;
          side_t::SetTexture(this->m_Line1->sidedef[0],1,
                             (FTextureID)this->m_DoorAnim->TextureFrames[this->m_Frame].texnum);
          side_t::SetTexture(this->m_Line1->sidedef[1],1,
                             (FTextureID)this->m_DoorAnim->TextureFrames[this->m_Frame].texnum);
          side_t::SetTexture(this->m_Line2->sidedef[0],1,
                             (FTextureID)this->m_DoorAnim->TextureFrames[this->m_Frame].texnum);
          side_t::SetTexture(this->m_Line2->sidedef[1],1,
                             (FTextureID)this->m_DoorAnim->TextureFrames[this->m_Frame].texnum);
        }
        else {
          this->m_Line1->flags = this->m_Line1->flags & 0xfffffffe;
          this->m_Line2->flags = this->m_Line2->flags & 0xfffffffe;
          if (this->m_Delay == 0) {
            TObjPtr<DSectorEffect>::operator=
                      (&((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)->
                        ceilingdata,(DSectorEffect *)0x0);
            (*(this->super_DMovingCeiling).super_DMover.super_DSectorEffect.super_DThinker.
              super_DObject._vptr_DObject[4])();
          }
          else {
            this->m_Timer = this->m_Delay;
            this->m_Status = 1;
          }
        }
      }
      break;
    case 1:
      iVar2 = this->m_Timer;
      this->m_Timer = iVar2 + -1;
      if ((iVar2 == 0) && (bVar1 = StartClosing(this), !bVar1)) {
        this->m_Timer = this->m_Delay;
      }
      break;
    case 2:
      iVar2 = this->m_Timer;
      this->m_Timer = iVar2 + -1;
      if (iVar2 == 0) {
        iVar2 = this->m_Frame + -1;
        this->m_Frame = iVar2;
        if (iVar2 < 0) {
          sector_t::MoveCeiling
                    ((sector_t *)
                     (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,2048.0,
                     this->m_BotDist,-1);
          TObjPtr<DSectorEffect>::operator=
                    (&((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)->
                      ceilingdata,(DSectorEffect *)0x0);
          (*(this->super_DMovingCeiling).super_DMover.super_DSectorEffect.super_DThinker.
            super_DObject._vptr_DObject[4])();
          if ((this->m_SetBlocking1 & 1U) == 0) {
            this->m_Line1->flags = this->m_Line1->flags & 0xfffffffe;
          }
          if ((this->m_SetBlocking2 & 1U) == 0) {
            this->m_Line2->flags = this->m_Line2->flags & 0xfffffffe;
          }
        }
        else {
          this->m_Timer = this->m_Speed;
          side_t::SetTexture(this->m_Line1->sidedef[0],1,
                             (FTextureID)this->m_DoorAnim->TextureFrames[this->m_Frame].texnum);
          side_t::SetTexture(this->m_Line1->sidedef[1],1,
                             (FTextureID)this->m_DoorAnim->TextureFrames[this->m_Frame].texnum);
          side_t::SetTexture(this->m_Line2->sidedef[0],1,
                             (FTextureID)this->m_DoorAnim->TextureFrames[this->m_Frame].texnum);
          side_t::SetTexture(this->m_Line2->sidedef[1],1,
                             (FTextureID)this->m_DoorAnim->TextureFrames[this->m_Frame].texnum);
        }
      }
      break;
    case 3:
      TObjPtr<DSectorEffect>::operator=
                (&((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)->
                  ceilingdata,(DSectorEffect *)0x0);
      (*(this->super_DMovingCeiling).super_DMover.super_DSectorEffect.super_DThinker.super_DObject.
        _vptr_DObject[4])();
    }
  }
  return;
}

Assistant:

void DAnimatedDoor::Tick ()
{
	if (m_DoorAnim == NULL)
	{
		// can only happen when a bad savegame is loaded.
		Destroy();
		return;
	}

	switch (m_Status)
	{
	case Dead:
		m_Sector->ceilingdata = NULL;
		Destroy ();
		break;

	case Opening:
		if (!m_Timer--)
		{
			if (++m_Frame >= m_DoorAnim->NumTextureFrames)
			{
				// IF DOOR IS DONE OPENING...
				m_Line1->flags &= ~ML_BLOCKING;
				m_Line2->flags &= ~ML_BLOCKING;

				if (m_Delay == 0)
				{
					m_Sector->ceilingdata = NULL;
					Destroy ();
					break;
				}

				m_Timer = m_Delay;
				m_Status = Waiting;
			}
			else
			{
				// IF DOOR NEEDS TO ANIMATE TO NEXT FRAME...
				m_Timer = m_Speed;

				m_Line1->sidedef[0]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
				m_Line1->sidedef[1]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
				m_Line2->sidedef[0]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
				m_Line2->sidedef[1]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
			}
		}
		break;

	case Waiting:
		// IF DOOR IS DONE WAITING...
		if (!m_Timer--)
		{
			if (!StartClosing())
			{
				m_Timer = m_Delay;
			}
		}
		break;

	case Closing:
		if (!m_Timer--)
		{
			if (--m_Frame < 0)
			{
				// IF DOOR IS DONE CLOSING...
				m_Sector->MoveCeiling (2048., m_BotDist, -1);
				m_Sector->ceilingdata = NULL;
				Destroy ();
				// Unset blocking flags on lines that didn't start with them. Since the
				// ceiling is down now, we shouldn't need this flag anymore to keep things
				// from getting through.
				if (!m_SetBlocking1)
				{
					m_Line1->flags &= ~ML_BLOCKING;
				}
				if (!m_SetBlocking2)
				{
					m_Line2->flags &= ~ML_BLOCKING;
				}
				break;
			}
			else
			{
				// IF DOOR NEEDS TO ANIMATE TO NEXT FRAME...
				m_Timer = m_Speed;

				m_Line1->sidedef[0]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
				m_Line1->sidedef[1]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
				m_Line2->sidedef[0]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
				m_Line2->sidedef[1]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
			}
		}
		break;
	}
}